

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TexBindingCase::iterate(TexBindingCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  GLuint texture;
  ScopedLogSection section;
  CallLogWrapper gl;
  ScopedLogSection section_1;
  ResultCollector result;
  string local_150;
  GLuint local_12c;
  string local_128;
  ScopedLogSection local_108;
  long local_100;
  TestLog local_f8;
  long lStack_f0;
  CallLogWrapper local_e8;
  ScopedLogSection local_d0;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ResultCollector local_88;
  code *local_38;
  GLenum local_30;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_e8,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_88,pTVar3,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_e8.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"initial","");
  paVar2 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (&local_88,&local_e8,this->m_bindTarget,0,this->m_verifierType);
  tcu::TestLog::endSection(local_108.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"bind","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"After bind","");
  tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenTextures(&local_e8,1,&local_12c);
  glu::CallLogWrapper::glBindTexture(&local_e8,this->m_texTarget,local_12c);
  GVar5 = glu::CallLogWrapper::glGetError(&local_e8);
  if (GVar5 == 0) goto LAB_014fa063;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
  local_38 = glu::getErrorName;
  local_30 = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_38);
  uVar8 = 0xf;
  if (local_a8 != local_98) {
    uVar8 = local_98[0];
  }
  if (uVar8 < local_c8._M_string_length + local_a0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar9 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_c8._M_string_length + local_a0) goto LAB_014f9ebe;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_014f9ebe:
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
  }
  local_108.m_log = &local_f8;
  pTVar3 = (TestLog *)(plVar6 + 2);
  if ((TestLog *)*plVar6 == pTVar3) {
    local_f8.m_log = pTVar3->m_log;
    lStack_f0 = plVar6[3];
  }
  else {
    local_f8.m_log = pTVar3->m_log;
    local_108.m_log = (TestLog *)*plVar6;
  }
  local_100 = plVar6[1];
  *plVar6 = (long)pTVar3;
  plVar6[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_128.field_2._M_allocated_capacity = *psVar7;
    local_128.field_2._8_8_ = plVar6[3];
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar7;
    local_128._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_128._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_150.field_2._M_allocated_capacity = *psVar7;
    local_150.field_2._8_8_ = plVar6[3];
    local_150._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar7;
    local_150._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_150._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::ResultCollector::fail(&local_88,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_108.m_log != &local_f8) {
    operator_delete(local_108.m_log,(ulong)((long)&(local_f8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
LAB_014fa063:
  deqp::gls::StateQueryUtil::verifyStateInteger
            (&local_88,&local_e8,this->m_bindTarget,local_12c,this->m_verifierType);
  glu::CallLogWrapper::glDeleteTextures(&local_e8,1,&local_12c);
  tcu::TestLog::endSection(local_d0.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"bind","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"After delete","");
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (&local_88,&local_e8,this->m_bindTarget,0,this->m_verifierType);
  tcu::TestLog::endSection(local_108.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_88,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_message._M_dataplus._M_p != &local_88.m_message.field_2) {
    operator_delete(local_88.m_message._M_dataplus._M_p,
                    local_88.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_prefix._M_dataplus._M_p != &local_88.m_prefix.field_2) {
    operator_delete(local_88.m_prefix._M_dataplus._M_p,
                    local_88.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_e8);
  return STOP;
}

Assistant:

TexBindingCase::IterateResult TexBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial value");

		verifyStateInteger(result, gl, m_bindTarget, 0, m_verifierType);
	}

	// bind
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After bind");

		glw::GLuint texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(m_texTarget, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		verifyStateInteger(result, gl, m_bindTarget, texture, m_verifierType);

		gl.glDeleteTextures(1, &texture);
	}

	// after delete
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After delete");

		verifyStateInteger(result, gl, m_bindTarget, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}